

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall GEO::geofile::simplify_plane_surfaces(geofile *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  undefined8 this_00;
  geofile *pgVar3;
  long lVar4;
  _Rb_tree_header *p_Var5;
  geofile *pgVar6;
  geofile *this_01;
  size_t i;
  ulong uVar7;
  set<int,_std::less<int>,_std::allocator<int>_> gaps;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  set<int,_std::less<int>,_std::allocator<int>_> numbers;
  undefined1 local_fc [12];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_f0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pgVar6 = (geofile *)
           (this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  _Var2 = (pgVar6->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (1 < (int)_Var2) {
    uVar7 = 1;
    do {
      local_fc._0_4_ = (undefined4)uVar7;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&local_f0,(int *)local_fc);
      uVar7 = uVar7 + 1;
    } while (uVar7 <= _Var2 - _S_black);
    pgVar6 = (geofile *)
             (this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var1 = &(this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header;
  this_01 = (geofile *)p_Var1;
  local_fc._4_8_ = this;
  pgVar3 = (geofile *)std::_Rb_tree_decrement(&p_Var1->_M_header);
  if (pgVar6 != pgVar3) {
    do {
      this_01 = pgVar6;
      lVar4 = std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
      p_Var5 = &(this_01->points_map)._M_t._M_impl.super__Rb_tree_header;
      while (local_fc._0_4_ = (p_Var5->_M_header)._M_color + _S_black,
            (int)local_fc._0_4_ < *(int *)(lVar4 + 0x20)) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_f0,(int *)local_fc);
        p_Var5 = (_Rb_tree_header *)local_fc;
      }
      pgVar6 = (geofile *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
    } while (pgVar6 != pgVar3);
  }
  this_00 = local_fc._4_8_;
  if (local_f0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pgVar6 = (geofile *)
             (((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              (local_fc._4_8_ + 0xa8))->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pgVar6 != (geofile *)p_Var1) {
      do {
        this_01 = pgVar6;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_90,(int *)&(this_01->points_map)._M_t._M_impl.super__Rb_tree_header);
        pgVar6 = (geofile *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_01);
      } while (pgVar6 != (geofile *)p_Var1);
    }
    perform_shift(this_01,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_f0,
                  (set<int,_std::less<int>,_std::allocator<int>_> *)&local_90,
                  (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  &local_c0);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_Rb_tree(&local_60,&local_c0);
    adjust_plane_surfaces
              ((geofile *)this_00,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &local_60);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_60);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_c0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_f0);
  return 0;
}

Assistant:

int GEO::geofile::simplify_plane_surfaces()
{
    std::set<int>       gaps;
    std::set<int>       numbers;
    std::map<int, int>  changes;
    // Store all gaps
    // before start
    if (plane_surfaces_map.begin()->first>1)
    {
        int total_pre_gaps = plane_surfaces_map.begin()->first - 1;
        for (size_t i = 1; i <= total_pre_gaps; i++)
        {
            gaps.insert(i);
        }
    }
    // after start
    auto plane_surface_it_end   = std::prev(plane_surfaces_map.end(),1);
    for (auto pl_sur_it = plane_surfaces_map.begin(); pl_sur_it!=plane_surface_it_end; pl_sur_it++)
    {
        auto look_ahead = std::next(pl_sur_it,1);
        for (int i = pl_sur_it->first+1; i < look_ahead->first; i++)
        {
            gaps.insert(i);
        }
    }
    if (!gaps.empty())
    {
        // Store all non-gaps
        plane_surface_it_end = plane_surfaces_map.end();
        for (auto pl_sur_it = plane_surfaces_map.begin(); pl_sur_it != plane_surface_it_end; pl_sur_it++)
        {
            numbers.insert(pl_sur_it->first);
        }
        perform_shift(gaps, numbers, changes);
        return adjust_plane_surfaces(changes);
    }
    return EXIT_SUCCESS;
}